

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

void report_bad(bool passed,char *c)

{
  char *local_20;
  char *c_local;
  bool passed_local;
  
  if (passed) {
    local_20 = "pass";
  }
  else {
    local_20 = "FAIL";
  }
  printf("%s: decoding bad  ",local_20);
  test_utf8_char_print(c);
  printf(" ");
  return;
}

Assistant:

static void report_bad(bool passed, test_utf8_char const c)
{
  printf("%s: decoding bad  ", passed ? "pass" : "FAIL");
  test_utf8_char_print(c);
  printf(" ");
}